

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

int __thiscall
Catch::Generators::anon_unknown_3::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  long lVar1;
  pointer pcVar2;
  pointer puVar3;
  ITracker *pIVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  _Var8;
  GeneratorUntypedBase *pGVar9;
  GeneratorUntypedBase *pGVar10;
  long lVar11;
  ulong uVar12;
  pointer puVar13;
  pointer puVar14;
  GeneratorTracker *pGVar15;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  pGVar10 = (GeneratorUntypedBase *)
            (this->super_TrackerBase).super_ITracker.m_children.
            super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  _Var8._M_current =
       (StringRef *)
       (this->super_TrackerBase).super_ITracker.m_children.
       super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar10 != (GeneratorUntypedBase *)_Var8._M_current) {
    uVar12 = (long)_Var8._M_current - (long)pGVar10;
    pGVar15 = this;
    if (0 < (long)uVar12 >> 5) {
      pGVar9 = (GeneratorUntypedBase *)
               ((long)&pGVar10->_vptr_GeneratorUntypedBase + (uVar12 & 0xffffffffffffffe0));
      lVar11 = ((long)uVar12 >> 5) + 1;
      pGVar10 = (GeneratorUntypedBase *)&(pGVar10->m_stringReprCache)._M_string_length;
      do {
        lVar1 = *(long *)((long)&pGVar10[-1].m_stringReprCache.field_2 + 8);
        if (lVar1 == 0) goto LAB_0016e345;
        if (*(int *)(lVar1 + 0x58) != 0) {
          pGVar10 = (GeneratorUntypedBase *)((long)&pGVar10[-1].m_stringReprCache.field_2 + 8);
          goto LAB_0016e236;
        }
        if (pGVar10[-1].m_currentElementIndex == 0) goto LAB_0016e345;
        if (*(int *)(pGVar10[-1].m_currentElementIndex + 0x58) != 0) {
          pGVar10 = (GeneratorUntypedBase *)&pGVar10[-1].m_currentElementIndex;
          goto LAB_0016e236;
        }
        if (pGVar10->_vptr_GeneratorUntypedBase == (_func_int **)0x0) goto LAB_0016e345;
        if (*(int *)(pGVar10->_vptr_GeneratorUntypedBase + 0xb) != 0) goto LAB_0016e236;
        pcVar2 = (pGVar10->m_stringReprCache)._M_dataplus._M_p;
        if (pcVar2 == (pointer)0x0) goto LAB_0016e345;
        if (*(int *)(pcVar2 + 0x58) != 0) {
          pGVar10 = (GeneratorUntypedBase *)&pGVar10->m_stringReprCache;
          goto LAB_0016e236;
        }
        lVar11 = lVar11 + -1;
        pGVar10 = (GeneratorUntypedBase *)((pGVar10->m_stringReprCache).field_2._M_local_buf + 8);
      } while (1 < lVar11);
      uVar12 = (long)_Var8._M_current - (long)pGVar9;
      pGVar10 = pGVar9;
    }
    lVar11 = (long)uVar12 >> 3;
    if (lVar11 == 1) {
LAB_0016e20d:
      if (pGVar10->_vptr_GeneratorUntypedBase == (_func_int **)0x0) {
LAB_0016e345:
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                      ,0x389,
                      "const T *Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::operator->() const [T = Catch::TestCaseTracking::ITracker]"
                     );
      }
      if (*(int *)(pGVar10->_vptr_GeneratorUntypedBase + 0xb) == 0) {
        pGVar10 = (GeneratorUntypedBase *)_Var8._M_current;
      }
LAB_0016e236:
      if (pGVar10 != (GeneratorUntypedBase *)_Var8._M_current) goto LAB_0016e23b;
    }
    else {
      if (lVar11 == 2) {
LAB_0016e1f7:
        if (pGVar10->_vptr_GeneratorUntypedBase == (_func_int **)0x0) goto LAB_0016e345;
        if (*(int *)(pGVar10->_vptr_GeneratorUntypedBase + 0xb) == 0) {
          pGVar10 = (GeneratorUntypedBase *)&pGVar10->m_stringReprCache;
          goto LAB_0016e20d;
        }
        goto LAB_0016e236;
      }
      if (lVar11 == 3) {
        if (pGVar10->_vptr_GeneratorUntypedBase == (_func_int **)0x0) goto LAB_0016e345;
        if (*(int *)(pGVar10->_vptr_GeneratorUntypedBase + 0xb) == 0) {
          pGVar10 = (GeneratorUntypedBase *)&pGVar10->m_stringReprCache;
          goto LAB_0016e1f7;
        }
        goto LAB_0016e236;
      }
    }
    do {
      pGVar15 = (GeneratorTracker *)(pGVar15->super_TrackerBase).super_ITracker.m_parent;
      iVar7 = (*(pGVar15->super_TrackerBase).super_ITracker._vptr_ITracker[5])(pGVar15);
    } while ((char)iVar7 == '\0');
    _Var8._M_current = (StringRef *)(pGVar15->super_IGeneratorTracker)._vptr_IGeneratorTracker;
    bVar5 = true;
    if ((GeneratorUntypedBase *)_Var8._M_current == (pGVar15->m_generator).m_ptr) goto LAB_0016e23d;
    puVar14 = (this->super_TrackerBase).super_ITracker.m_children.
              super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->super_TrackerBase).super_ITracker.m_children.
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar14 != puVar3) {
      do {
        if (puVar14->m_ptr == (ITracker *)0x0) goto LAB_0016e345;
        uVar6 = (*puVar14->m_ptr->_vptr_ITracker[5])();
        _Var8._M_current = (StringRef *)(ulong)uVar6;
        if ((char)uVar6 != '\0') {
          pIVar4 = puVar14->m_ptr;
          if (pIVar4 == (ITracker *)0x0) {
            __assert_fail("m_ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                          ,0x381,
                          "const T &Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::operator*() const [T = Catch::TestCaseTracking::ITracker]"
                         );
          }
          local_40 = *(undefined4 *)((long)&pIVar4[1].m_nameAndLocation.name.field_2 + 8);
          uStack_3c = *(undefined4 *)((long)&pIVar4[1].m_nameAndLocation.name.field_2 + 0xc);
          uStack_38 = *(undefined4 *)&pIVar4[1].m_nameAndLocation.location.file;
          uStack_34 = *(undefined4 *)((long)&pIVar4[1].m_nameAndLocation.location.file + 4);
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<Catch::StringRef_const*,std::vector<Catch::StringRef,std::allocator<Catch::StringRef>>>,__gnu_cxx::__ops::_Iter_equals_val<Catch::StringRef_const>>
                            ((pGVar15->super_IGeneratorTracker)._vptr_IGeneratorTracker,
                             (pGVar15->m_generator).m_ptr,&local_40);
          if ((GeneratorUntypedBase *)_Var8._M_current != (pGVar15->m_generator).m_ptr)
          goto LAB_0016e23d;
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar3);
    }
  }
LAB_0016e23b:
  bVar5 = false;
LAB_0016e23d:
  pGVar10 = (this->m_generator).m_ptr;
  if (pGVar10 == (GeneratorUntypedBase *)0x0) {
    __assert_fail("m_generator && \"Tracker without generator\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x1459,
                  "virtual void Catch::Generators::(anonymous namespace)::GeneratorTracker::close()"
                 );
  }
  if (!bVar5) {
    if ((this->super_TrackerBase).super_ITracker.m_runState != CompletedSuccessfully) {
      return (int)_Var8._M_current;
    }
    iVar7 = (**pGVar10->_vptr_GeneratorUntypedBase)(pGVar10);
    if ((char)iVar7 == '\0') {
      return iVar7;
    }
    (pGVar10->m_stringReprCache)._M_string_length = 0;
    _Var8._M_current = (StringRef *)(pGVar10->m_stringReprCache)._M_dataplus._M_p;
    *(undefined1 *)&((GeneratorUntypedBase *)_Var8._M_current)->_vptr_GeneratorUntypedBase = 0;
    pGVar10->m_currentElementIndex = pGVar10->m_currentElementIndex + 1;
  }
  iVar7 = (int)_Var8._M_current;
  puVar14 = (this->super_TrackerBase).super_ITracker.m_children.
            super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->super_TrackerBase).super_ITracker.m_children.
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar13 = puVar14;
  if (puVar3 != puVar14) {
    do {
      if (puVar13->m_ptr != (ITracker *)0x0) {
        uVar6 = (*puVar13->m_ptr->_vptr_ITracker[1])();
        _Var8._M_current = (StringRef *)(ulong)uVar6;
      }
      iVar7 = (int)_Var8._M_current;
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar3);
    (this->super_TrackerBase).super_ITracker.m_children.
    super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar14;
  }
  (this->super_TrackerBase).super_ITracker.m_runState = Executing;
  return iVar7;
}

Assistant:

void close() override {
                    TrackerBase::close();
                    // If a generator has a child (it is followed by a section)
                    // and none of its children have started, then we must wait
                    // until later to start consuming its values.
                    // This catches cases where `GENERATE` is placed between two
                    // `SECTION`s.
                    // **The check for m_children.empty cannot be removed**.
                    // doing so would break `GENERATE` _not_ followed by
                    // `SECTION`s.
                    const bool should_wait_for_child = [&]() {
                        // No children -> nobody to wait for
                        if ( m_children.empty() ) { return false; }
                        // If at least one child started executing, don't wait
                        if ( std::find_if(
                                 m_children.begin(),
                                 m_children.end(),
                                 []( TestCaseTracking::ITrackerPtr const&
                                         tracker ) {
                                     return tracker->hasStarted();
                                 } ) != m_children.end() ) {
                            return false;
                        }

                        // No children have started. We need to check if they
                        // _can_ start, and thus we should wait for them, or
                        // they cannot start (due to filters), and we shouldn't
                        // wait for them
                        ITracker* parent = m_parent;
                        // This is safe: there is always at least one section
                        // tracker in a test case tracking tree
                        while ( !parent->isSectionTracker() ) {
                            parent = parent->parent();
                        }
                        assert( parent &&
                                "Missing root (test case) level section" );

                        auto const& parentSection =
                            static_cast<SectionTracker const&>( *parent );
                        auto const& filters = parentSection.getFilters();
                        // No filters -> no restrictions on running sections
                        if ( filters.empty() ) { return true; }

                        for ( auto const& child : m_children ) {
                            if ( child->isSectionTracker() &&
                                 std::find( filters.begin(),
                                            filters.end(),
                                            static_cast<SectionTracker const&>(
                                                *child )
                                                .trimmedName() ) !=
                                     filters.end() ) {
                                return true;
                            }
                        }
                        return false;
                    }();

                    // This check is a bit tricky, because m_generator->next()
                    // has a side-effect, where it consumes generator's current
                    // value, but we do not want to invoke the side-effect if
                    // this generator is still waiting for any child to start.
                    assert( m_generator && "Tracker without generator" );
                    if ( should_wait_for_child ||
                         ( m_runState == CompletedSuccessfully &&
                           m_generator->countedNext() ) ) {
                        m_children.clear();
                        m_runState = Executing;
                    }
                }